

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglQueryConfigTests.cpp
# Opt level: O1

void __thiscall
deqp::egl::GetConfigAttribBufferSizeCase::executeTest
          (GetConfigAttribBufferSizeCase *this,EGLConfig config)

{
  ostringstream *poVar1;
  TestLog *pTVar2;
  EGLint EVar3;
  EGLint EVar4;
  EGLint EVar5;
  EGLint EVar6;
  EGLint EVar7;
  EGLint EVar8;
  EGLint EVar9;
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  
  pTVar2 = ((this->super_GetConfigAttribCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx
           )->m_log;
  EVar3 = GetConfigAttribCase::getValue(&this->super_GetConfigAttribCase,config,0x303f,true);
  EVar4 = GetConfigAttribCase::getValue(&this->super_GetConfigAttribCase,config,0x3020,true);
  EVar5 = GetConfigAttribCase::getValue(&this->super_GetConfigAttribCase,config,0x3024,true);
  EVar6 = GetConfigAttribCase::getValue(&this->super_GetConfigAttribCase,config,0x3023,true);
  EVar7 = GetConfigAttribCase::getValue(&this->super_GetConfigAttribCase,config,0x3022,true);
  EVar8 = GetConfigAttribCase::getValue(&this->super_GetConfigAttribCase,config,0x303d,true);
  EVar9 = GetConfigAttribCase::getValue(&this->super_GetConfigAttribCase,config,0x3021,true);
  if (EVar9 < 0) {
    poVar1 = (ostringstream *)(local_1b0 + 8);
    local_1b0._0_8_ = pTVar2;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"Fail, alpha size must be zero or positive.",0x2a);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_138);
    tcu::TestContext::setTestResult
              ((this->super_GetConfigAttribCase).super_TestCase.super_TestCase.super_TestNode.
               m_testCtx,QP_TEST_RESULT_FAIL,"Invalid alpha size");
  }
  if (EVar3 == 0x308f) {
    if (EVar8 < 1) {
      poVar1 = (ostringstream *)(local_1b0 + 8);
      local_1b0._0_8_ = pTVar2;
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,"Fail, luminance size must be positive for a luminance buffer.",
                 0x3d);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      std::ios_base::~ios_base(local_138);
      tcu::TestContext::setTestResult
                ((this->super_GetConfigAttribCase).super_TestCase.super_TestCase.super_TestNode.
                 m_testCtx,QP_TEST_RESULT_FAIL,"Invalid luminance size");
    }
    if ((EVar6 != 0 || EVar5 != 0) || EVar7 != 0) {
      poVar1 = (ostringstream *)(local_1b0 + 8);
      local_1b0._0_8_ = pTVar2;
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,"Fail, RGB component sizes must be zero for a luminance buffer.",
                 0x3e);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      std::ios_base::~ios_base(local_138);
      tcu::TestContext::setTestResult
                ((this->super_GetConfigAttribCase).super_TestCase.super_TestCase.super_TestNode.
                 m_testCtx,QP_TEST_RESULT_FAIL,"Invalid color component size");
    }
    if (EVar4 == EVar9 + EVar8) {
      return;
    }
    local_1b0._0_8_ = pTVar2;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1b0 + 8));
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_1b0 + 8),
               "Fail, buffer size must be equal to the sum of luminance size and alpha size.",0x4c);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  else {
    if (EVar3 != 0x308e) {
      return;
    }
    if (EVar8 != 0) {
      poVar1 = (ostringstream *)(local_1b0 + 8);
      local_1b0._0_8_ = pTVar2;
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,"Fail, luminance size must be zero for an RGB buffer.",0x34);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      std::ios_base::~ios_base(local_138);
      tcu::TestContext::setTestResult
                ((this->super_GetConfigAttribCase).super_TestCase.super_TestCase.super_TestNode.
                 m_testCtx,QP_TEST_RESULT_FAIL,"Invalid luminance size");
    }
    if ((EVar6 < 1 || EVar5 < 1) || EVar7 < 1) {
      poVar1 = (ostringstream *)(local_1b0 + 8);
      local_1b0._0_8_ = pTVar2;
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,"Fail, RGB component sizes must be positive for an RGB buffer.",
                 0x3d);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      std::ios_base::~ios_base(local_138);
      tcu::TestContext::setTestResult
                ((this->super_GetConfigAttribCase).super_TestCase.super_TestCase.super_TestNode.
                 m_testCtx,QP_TEST_RESULT_FAIL,"Invalid color component size");
    }
    if (EVar4 == EVar7 + EVar9 + EVar6 + EVar5) {
      return;
    }
    local_1b0._0_8_ = pTVar2;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1b0 + 8));
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_1b0 + 8),
               "Fail, buffer size must be equal to the sum of RGB component sizes and alpha size.",
               0x51);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1b0 + 8));
  std::ios_base::~ios_base(local_138);
  tcu::TestContext::setTestResult
            ((this->super_GetConfigAttribCase).super_TestCase.super_TestCase.super_TestNode.
             m_testCtx,QP_TEST_RESULT_FAIL,"Invalid buffer size");
  return;
}

Assistant:

void executeTest (EGLConfig config)
	{
		TestLog&		log				= m_testCtx.getLog();

		const EGLint	colorBufferType	= getValue(config, EGL_COLOR_BUFFER_TYPE);

		const EGLint	bufferSize		= getValue(config, EGL_BUFFER_SIZE);
		const EGLint	redSize			= getValue(config, EGL_RED_SIZE);
		const EGLint	greenSize		= getValue(config, EGL_GREEN_SIZE);
		const EGLint	blueSize		= getValue(config, EGL_BLUE_SIZE);
		const EGLint	luminanceSize	= getValue(config, EGL_LUMINANCE_SIZE);
		const EGLint	alphaSize		= getValue(config, EGL_ALPHA_SIZE);

		if (alphaSize < 0)
		{
			log << TestLog::Message << "Fail, alpha size must be zero or positive." << TestLog::EndMessage;
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Invalid alpha size");
		}

		if (colorBufferType == EGL_RGB_BUFFER)
		{
			if (luminanceSize != 0)
			{
				log << TestLog::Message << "Fail, luminance size must be zero for an RGB buffer." << TestLog::EndMessage;
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Invalid luminance size");
			}

			if (redSize <= 0 || greenSize <= 0  || blueSize <= 0)
			{
				log << TestLog::Message << "Fail, RGB component sizes must be positive for an RGB buffer." << TestLog::EndMessage;
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Invalid color component size");
			}

			if (bufferSize != (redSize + greenSize + blueSize + alphaSize))
			{
				log << TestLog::Message << "Fail, buffer size must be equal to the sum of RGB component sizes and alpha size." << TestLog::EndMessage;
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Invalid buffer size");
			}
		}
		else if (colorBufferType == EGL_LUMINANCE_BUFFER)
		{
			if (luminanceSize <= 0)
			{
				log << TestLog::Message << "Fail, luminance size must be positive for a luminance buffer." << TestLog::EndMessage;
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Invalid luminance size");
			}

			if (redSize != 0 || greenSize != 0  || blueSize != 0)
			{
				log << TestLog::Message << "Fail, RGB component sizes must be zero for a luminance buffer." << TestLog::EndMessage;
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Invalid color component size");
			}

			if (bufferSize != (luminanceSize + alphaSize))
			{
				log << TestLog::Message << "Fail, buffer size must be equal to the sum of luminance size and alpha size." << TestLog::EndMessage;
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Invalid buffer size");
			}
		}
	}